

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O0

planck_unit_result_t
planck_unit_assert_true(planck_unit_test_t *state,int condition,int line,char *file,char *message)

{
  char *local_28;
  char *message_local;
  char *file_local;
  int line_local;
  int condition_local;
  planck_unit_test_t *state_local;
  
  if (condition == 0) {
    state->result = '\0';
    local_28 = message;
    file_local._0_4_ = line;
  }
  else {
    if (state->allocated_message == '\x01') {
      free(message);
    }
    file_local._0_4_ = -1;
    local_28 = "";
    state->allocated_message = '\0';
    state->result = '\x01';
  }
  state->line = (int)file_local;
  state->file = file;
  state->message = local_28;
  return state->result;
}

Assistant:

planck_unit_result_t
planck_unit_assert_true(
	planck_unit_test_t	*state,
	int					condition,
	int					line,
	const char			*file,
	char				*message
) {
	if (condition) {
		/* Do this now, since message pointer gets replaced */
		if (1 == state->allocated_message) {
			free(message);
		}

		line						= -1;
/*		file						= ""; */
/*		func						= ""; */
		message						= "";
		/* Message has been freed or replaced, and is no longer allocated */
		state->allocated_message	= 0;
		state->result				= PLANCK_UNIT_SUCCESS;
	}
	else {
		state->result = PLANCK_UNIT_FAILURE;
	}

	state->line			= line;
	state->file			= file;
	state->message		= message;

	return state->result;
}